

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# placalc.cpp
# Opt level: O1

void __thiscall placalc::doit(placalc *this,float relativeSecondaryFactor,float absoluteFactor)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  iterator iVar4;
  placalc *this_00;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  int sampleSize;
  gulSampleslevelRec gr;
  int gulstreamType;
  gulSampleslevelHeader gh;
  event_amplification ea;
  undefined4 local_78;
  int local_74;
  float local_70;
  uint local_6c;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  int local_58;
  int local_54;
  key_type local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_68 = absoluteFactor;
  uStack_64 = in_XMM1_Db;
  uStack_60 = in_XMM1_Dc;
  uStack_5c = in_XMM1_Dd;
  local_48 = relativeSecondaryFactor;
  LoadItemToAmplification();
  if ((local_68 == 0.0) && (!NAN(local_68))) {
    LoadPostLossAmplificationFactors(this,local_48);
  }
  local_6c = 0;
  fread(&local_6c,4,1,_stdin);
  this_00 = (placalc *)(ulong)local_6c;
  uVar1 = 0x1000000;
  if ((local_6c >> 0x18 & 1) == 0) {
    uVar1 = local_6c & 0x2000000;
  }
  if ((uVar1 != 0x1000000) && (uVar1 != 0x2000000)) {
    doit(this_00);
    if (*(void **)this_00 == (void *)0x0) {
      return;
    }
    operator_delete(*(void **)this_00);
    return;
  }
  fwrite(&local_6c,4,1,_stdout);
  local_78 = 0;
  sVar2 = fread(&local_78,4,1,_stdin);
  if (sVar2 == 0) {
    doit((placalc *)&local_78);
  }
  fwrite(&local_78,4,1,_stdout);
  local_48 = (float)(~-(uint)(local_68 == 0.0) & (uint)local_68 |
                    -(uint)(local_68 == 0.0) & 0x3f800000);
  uStack_44 = uStack_64;
  uStack_40 = uStack_60;
  uStack_3c = uStack_5c;
  do {
    if (sVar2 == 0) {
      return;
    }
    sVar3 = fread(&local_58,8,1,_stdin);
    if (sVar3 == 0) {
      sVar2 = 0;
    }
    else {
      fwrite(&local_58,8,1,_stdout);
      local_50.event_id = local_58;
      local_50.amplification_id = *(int *)(item_to_amplification_ + (long)local_54 * 4);
      iVar4 = std::
              _Hashtable<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)factors_,&local_50);
      local_68 = local_48;
      if (iVar4.super__Node_iterator_base<std::pair<const_event_amplification,_float>,_true>._M_cur
          != (__node_type *)0x0) {
        local_68 = *(float *)((long)iVar4.
                                    super__Node_iterator_base<std::pair<const_event_amplification,_float>,_true>
                                    ._M_cur + 0x10);
      }
      do {
        sVar2 = fread(&local_74,8,1,_stdin);
        if (sVar2 == 0) break;
        local_70 = local_70 * local_68;
        fwrite(&local_74,8,1,_stdout);
      } while (local_74 != 0);
    }
    if (sVar3 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void doit(const float relativeSecondaryFactor,
	    const float absoluteFactor) {

    LoadItemToAmplification();
    // Ignore loss factors file if absolute factor is specified
    if (absoluteFactor == 0.0) {
      LoadPostLossAmplificationFactors(relativeSecondaryFactor);
    }

    // Check input stream type is GUL item stream or loss stream and write type
    // to output
    int gulstreamType = 0;
    size_t i = fread(&gulstreamType, sizeof(gulstreamType), 1, stdin);
    int streamType = gulstreamType & gulstream_id;
    if (streamType == 0) {
      streamType = gulstreamType & loss_stream_id;
    }
    if (streamType != gulstream_id && streamType != loss_stream_id) {
      fprintf(stderr, "FATAL: placalc: %s: Not a valid gul stream type %d\n",
	      __func__, gulstreamType);
      exit(EXIT_FAILURE);
    }
    fwrite(&gulstreamType, sizeof(gulstreamType), 1, stdout);

    // Read in number of samples and write to output
    int sampleSize = 0;
    i = fread(&sampleSize, sizeof(sampleSize), 1, stdin);
    if (i == 0) {
      fprintf(stderr, "FATAL: placalc: %s: Invalid sample size %d\n", __func__,
	      sampleSize);
    }
    fwrite(&sampleSize, sizeof(sampleSize), 1, stdout);

    // Default factor is 1.0 or absolute factor given by user
    const float defaultFactor = (absoluteFactor == 0.0) ? 1.0 : absoluteFactor;

    // Read in data from GUL stream, apply Post Loss Amplification (PLA) factors
    // and write out to standard output
    while (i != 0) {
      event_amplification ea;
      gulSampleslevelHeader gh;
      i = fread(&gh, sizeof(gh), 1, stdin);
      if (i == 0) break;

      fwrite(&gh, sizeof(gh), 1, stdout);
      ea.event_id = gh.event_id;
      ea.amplification_id = item_to_amplification_[gh.item_id];
      // Default factor is used if post loss amplification factor is not present
      float factor = defaultFactor;
      auto iter = factors_.find(ea);
      if (iter != factors_.end()) factor = iter->second;

      gulSampleslevelRec gr;
      while ((i = fread(&gr, sizeof(gr), 1, stdin)) != 0) {
	gr.loss *= factor;
	fwrite(&gr, sizeof(gr), 1, stdout);
	if (gr.sidx == 0) break;
      }
    }

  }